

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

string * __thiscall
Assembler::instructionToAssembly_abi_cxx11_
          (string *__return_storage_ptr__,Assembler *this,Instruction *ins)

{
  uint uVar1;
  Operation OVar2;
  int32_t iVar3;
  pair<int,_int> pVar4;
  long *plVar5;
  undefined8 *puVar6;
  string *psVar7;
  uint uVar8;
  ulong *puVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  uint uVar12;
  _Base_ptr p_Var13;
  uint uVar14;
  uint uVar15;
  __string_type __str;
  long *local_d0;
  ulong local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  OVar2 = Instruction::getOpr(ins);
  p_Var10 = &ITATable_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
  if (ITATable_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
  {
    p_Var10 = &ITATable_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var13 = ITATable_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)OVar2 <= (int)p_Var13[1]._M_color) {
        p_Var10 = p_Var13;
      }
      p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < (int)OVar2];
    } while (p_Var13 != (_Base_ptr)0x0);
  }
  p_Var13 = &ITATable_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
  if (((_Rb_tree_header *)p_Var10 != &ITATable_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
     (p_Var13 = &ITATable_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header,
     (int)p_Var10[1]._M_color <= (int)OVar2)) {
    p_Var13 = p_Var10;
  }
  if ((_Rb_tree_header *)p_Var13 == &ITATable_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    psVar7 = (string *)__cxa_allocate_exception(0x28);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unvalid operation type","")
    ;
    *(string **)psVar7 = psVar7 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar7,local_50,local_50 + local_48);
    *(undefined8 *)(psVar7 + 0x20) = 0;
    __cxa_throw(psVar7,&Error::typeinfo,Error::~Error);
  }
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,p_Var13[1]._M_parent,
             (long)&(p_Var13[1]._M_parent)->_M_color + (long)&(p_Var13[1]._M_left)->_M_color);
  std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,'\x01');
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  iVar3 = Instruction::getParamNum(ins);
  if (iVar3 == 1) {
    pVar4 = Instruction::getParam(ins);
    uVar15 = pVar4.first;
    uVar12 = -uVar15;
    if (0 < (int)uVar15) {
      uVar12 = uVar15;
    }
    uVar14 = 1;
    if (9 < uVar12) {
      uVar11 = (ulong)uVar12;
      uVar1 = 4;
      do {
        uVar14 = uVar1;
        uVar8 = (uint)uVar11;
        if (uVar8 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_00119142;
        }
        if (uVar8 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_00119142;
        }
        if (uVar8 < 10000) goto LAB_00119142;
        uVar11 = uVar11 / 10000;
        uVar1 = uVar14 + 4;
      } while (99999 < uVar8);
      uVar14 = uVar14 + 1;
    }
LAB_00119142:
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar14 - (pVar4.first._3_1_ >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar15 >> 0x1f) + (long)local_d0),uVar14,uVar12);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
    local_60[0] = local_c0;
    plVar5 = local_d0;
    if (local_d0 == &local_c0) {
      return __return_storage_ptr__;
    }
    goto LAB_001192de;
  }
  if (iVar3 != 2) {
    return __return_storage_ptr__;
  }
  pVar4 = Instruction::getParam(ins);
  uVar15 = pVar4.first;
  uVar12 = -uVar15;
  if (0 < (int)uVar15) {
    uVar12 = uVar15;
  }
  uVar14 = 1;
  if (9 < uVar12) {
    uVar11 = (ulong)uVar12;
    uVar1 = 4;
    do {
      uVar14 = uVar1;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0011903b;
      }
      if (uVar8 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0011903b;
      }
      if (uVar8 < 10000) goto LAB_0011903b;
      uVar11 = uVar11 / 10000;
      uVar1 = uVar14 + 4;
    } while (99999 < uVar8);
    uVar14 = uVar14 + 1;
  }
LAB_0011903b:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar14 - (pVar4.first._3_1_ >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar15 >> 0x1f) + (long)local_70[0]),uVar14,uVar12);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_80 = *puVar9;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar9;
    local_90 = (ulong *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pVar4 = Instruction::getParam(ins);
  uVar15 = pVar4.second;
  uVar12 = -uVar15;
  if (0 < (int)uVar15) {
    uVar12 = uVar15;
  }
  uVar14 = 1;
  if (9 < uVar12) {
    uVar11 = (ulong)uVar12;
    uVar1 = 4;
    do {
      uVar14 = uVar1;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0011919b;
      }
      if (uVar8 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0011919b;
      }
      if (uVar8 < 10000) goto LAB_0011919b;
      uVar11 = uVar11 / 10000;
      uVar1 = uVar14 + 4;
    } while (99999 < uVar8);
    uVar14 = uVar14 + 1;
  }
LAB_0011919b:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar14 - (pVar4.second._3_1_ >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar15 >> 0x1f) + (long)local_b0),uVar14,uVar12);
  uVar11 = 0xf;
  if (local_90 != &local_80) {
    uVar11 = local_80;
  }
  if (uVar11 < (ulong)(local_a8 + local_88)) {
    uVar11 = 0xf;
    if (local_b0 != local_a0) {
      uVar11 = local_a0[0];
    }
    if (uVar11 < (ulong)(local_a8 + local_88)) goto LAB_0011920f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_0011920f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
  }
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_c0 = *plVar5;
    uStack_b8 = puVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*puVar6;
  }
  local_c8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  plVar5 = local_70[0];
  if (local_70[0] == local_60) {
    return __return_storage_ptr__;
  }
LAB_001192de:
  operator_delete(plVar5,local_60[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string Assembler::instructionToAssembly(Instruction & ins) {
	std::string ret;
	if (auto it = ITATable.find(ins.getOpr()); it != ITATable.end()) {
		ret += it->second + '\t';
	}
	else {
		throw Error("Unvalid operation type");
	}
	switch (ins.getParamNum())
	{
	case 0:
		break;
	case 1:
		ret += std::to_string(ins.getParam().first);
		break;
	case 2:
		ret += std::to_string(ins.getParam().first) + ", " + std::to_string(ins.getParam().second);
		break;
	default:
		break;
	}
	return ret;
}